

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::setLineEdit(QAbstractSpinBox *this,QLineEdit *lineEdit)

{
  long *plVar1;
  QLineEdit *pQVar2;
  void **ppvVar3;
  int iVar4;
  QValidator *pQVar5;
  QStyle *pQVar6;
  undefined4 *puVar7;
  QWidget *pQVar8;
  long in_FS_OFFSET;
  ulong uVar9;
  int *piVar10;
  QObject local_80 [8];
  QObject local_78 [8];
  undefined1 local_70 [16];
  QWidget *local_60;
  code *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lineEdit != (QLineEdit *)0x0) {
    plVar1 = *(long **)(this + 8);
    pQVar2 = (QLineEdit *)plVar1[0x6f];
    if (pQVar2 != lineEdit) {
      if (pQVar2 != (QLineEdit *)0x0) {
        (**(code **)(*(long *)&pQVar2->super_QWidget + 0x20))();
      }
      plVar1[0x6f] = (long)lineEdit;
      local_60 = &lineEdit->super_QWidget;
      ::QVariant::fromValue<QWidget_*,_true>
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<QWidget_*>,_std::is_destructible<QWidget_*>_>,_QVariant>
                  *)local_58,&local_60);
      QObject::setProperty
                ((QObject *)this,"_q_spinbox_lineedit",
                 (enable_if_t<std::conjunction_v<std::is_copy_constructible<QWidget_*>,_std::is_destructible<QWidget_*>_>,_QVariant>
                  *)local_58);
      ::QVariant::~QVariant
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<QWidget_*>,_std::is_destructible<QWidget_*>_>,_QVariant>
                  *)local_58);
      pQVar5 = QLineEdit::validator((QLineEdit *)plVar1[0x6f]);
      if (pQVar5 == (QValidator *)0x0) {
        QLineEdit::setValidator((QLineEdit *)plVar1[0x6f],(QValidator *)plVar1[0x70]);
      }
      pQVar8 = (QWidget *)plVar1[0x6f];
      if (*(QAbstractSpinBox **)(*(long *)&pQVar8->field_0x8 + 0x10) != this) {
        QWidget::setParent(pQVar8,(QWidget *)this);
        pQVar8 = (QWidget *)plVar1[0x6f];
      }
      pQVar6 = QWidget::style((QWidget *)this);
      iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x73,0,this,0);
      QLineEdit::setFrame((QLineEdit *)pQVar8,iVar4 == 0);
      QWidget::setFocusProxy((QWidget *)plVar1[0x6f],(QWidget *)this);
      QWidget::setAcceptDrops((QWidget *)plVar1[0x6f],false);
      if ((int)plVar1[0x71] != 0) {
        local_58[0] = QAbstractSpinBoxPrivate::editorTextChanged;
        local_58[1] = (code *)0x0;
        QObjectPrivate::
        connect<void(QLineEdit::*)(QString_const&),void(QAbstractSpinBoxPrivate::*)(QString_const&)>
                  ((Object *)(local_70 + 8),plVar1[0x6f],(Object *)QLineEdit::textChanged,0,
                   (ConnectionType)plVar1);
        QMetaObject::Connection::~Connection((Connection *)(local_70 + 8));
        local_58[0] = (code *)0xe9;
        local_58[1] = (code *)0x0;
        uVar9 = 0;
        QObjectPrivate::
        connect<void(QLineEdit::*)(int,int),void(QAbstractSpinBoxPrivate::*)(int,int)>
                  ((Object *)local_70,plVar1[0x6f],(Object *)QLineEdit::cursorPositionChanged,0,
                   (ConnectionType)plVar1);
        QMetaObject::Connection::~Connection((Connection *)local_70);
        ppvVar3 = (void **)plVar1[0x6f];
        local_58[0] = QLineEdit::cursorPositionChanged;
        local_58[1] = (code *)0x0;
        puVar7 = (undefined4 *)operator_new(0x18);
        *puVar7 = 1;
        *(code **)(puVar7 + 2) =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractspinbox.cpp:711:23),_QtPrivate::List<>,_void>
             ::impl;
        *(QAbstractSpinBox **)(puVar7 + 4) = this;
        piVar10 = (int *)(uVar9 & 0xffffffff00000000);
        QObject::connectImpl
                  (local_78,ppvVar3,(QObject *)local_58,(void **)this,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar7,piVar10,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_78);
        ppvVar3 = *(void ***)(*(long *)(plVar1[0x6f] + 8) + 600);
        local_58[0] = QWidgetLineControl::updateMicroFocus;
        local_58[1] = (code *)0x0;
        puVar7 = (undefined4 *)operator_new(0x18);
        *puVar7 = 1;
        *(code **)(puVar7 + 2) =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractspinbox.cpp:713:23),_QtPrivate::List<>,_void>
             ::impl;
        *(QAbstractSpinBox **)(puVar7 + 4) = this;
        QObject::connectImpl
                  (local_80,ppvVar3,(QObject *)local_58,(void **)this,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar7,(int *)((ulong)piVar10 & 0xffffffff00000000),
                   (QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_80);
      }
      (**(code **)(*plVar1 + 0x100))(plVar1);
      QWidget::setContextMenuPolicy((QWidget *)plVar1[0x6f],NoContextMenu);
      pQVar8 = (QWidget *)plVar1[0x6f];
      *(QAbstractSpinBox **)(*(long *)(*(long *)&pQVar8->field_0x8 + 600) + 0x130) = this;
      if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
        QWidget::show(pQVar8);
        if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
          (**(code **)(*plVar1 + 0xc0))(plVar1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::setLineEdit(QLineEdit *lineEdit)
{
    Q_D(QAbstractSpinBox);

    if (!lineEdit) {
        Q_ASSERT(lineEdit);
        return;
    }

    if (lineEdit == d->edit)
        return;

    delete d->edit;
    d->edit = lineEdit;
    setProperty("_q_spinbox_lineedit", QVariant::fromValue<QWidget *>(d->edit));
    if (!d->edit->validator())
        d->edit->setValidator(d->validator);

    if (d->edit->parent() != this)
        d->edit->setParent(this);

    d->edit->setFrame(!style()->styleHint(QStyle::SH_SpinBox_ButtonsInsideFrame, nullptr, this));
    d->edit->setFocusProxy(this);
    d->edit->setAcceptDrops(false);

    if (d->type != QMetaType::UnknownType) {
        QObjectPrivate::connect(d->edit, &QLineEdit::textChanged,
                                d, &QAbstractSpinBoxPrivate::editorTextChanged);
        QObjectPrivate::connect(d->edit, &QLineEdit::cursorPositionChanged,
                                d, &QAbstractSpinBoxPrivate::editorCursorPositionChanged);
        connect(d->edit, &QLineEdit::cursorPositionChanged,
                this, [this]() { updateMicroFocus(); });
        connect(d->edit->d_func()->control, &QWidgetLineControl::updateMicroFocus,
                this, [this]() { updateMicroFocus(); });
    }
    d->updateEditFieldGeometry();
    d->edit->setContextMenuPolicy(Qt::NoContextMenu);
    d->edit->d_func()->control->setAccessibleObject(this);

    if (isVisible())
        d->edit->show();
    if (isVisible())
        d->updateEdit();
}